

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incbi.c
# Opt level: O0

double hcephes_incbi(double aa,double bb,double yy0)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_ac;
  int nflg;
  int dir;
  int rflg;
  int i;
  double xt;
  double yh;
  double yl;
  double dithresh;
  double di;
  double yp;
  double lgm;
  double x1;
  double x0;
  double x;
  double y;
  double d;
  double y0;
  double b;
  double a;
  double yy0_local;
  double bb_local;
  double aa_local;
  
  if (yy0 <= 0.0) {
    aa_local = 0.0;
  }
  else {
    if (yy0 < 1.0) {
      x1 = 0.0;
      yh = 0.0;
      lgm = 1.0;
      xt = 1.0;
      bVar2 = false;
      d = yy0;
      y0 = bb;
      b = aa;
      if ((aa <= 1.0) || (bb <= 1.0)) {
        yl = 1e-06;
        bVar1 = false;
        x0 = aa / (aa + bb);
        x = hcephes_incbet(aa,bb,x0);
      }
      else {
        yl = 0.0001;
        dVar3 = hcephes_ndtri(yy0);
        di = -dVar3;
        bVar1 = 0.5 < yy0;
        if (bVar1) {
          d = 1.0 - yy0;
          di = dVar3;
          y0 = aa;
          b = bb;
        }
        dVar3 = (di * di + -3.0) / 6.0;
        dVar4 = 2.0 / (1.0 / (b + b + -1.0) + 1.0 / (y0 + y0 + -1.0));
        dVar5 = sqrt(dVar4 + dVar3);
        dVar3 = (-(1.0 / (y0 + y0 + -1.0) - 1.0 / (b + b + -1.0)) *
                 ((dVar3 + 0.8333333333333334) - 2.0 / (dVar4 * 3.0)) + (di * dVar5) / dVar4) * 2.0;
        if (dVar3 < -745.1332191019412) {
LAB_00107846:
          hcephes_mtherr("incbi",4);
          x0 = 0.0;
LAB_00107c0c:
          if (bVar1) {
            if (1.1102230246251565e-16 < x0) {
              x0 = 1.0 - x0;
            }
            else {
              x0 = 0.9999999999999999;
            }
          }
          return x0;
        }
        dVar3 = exp(dVar3);
        x0 = b / (y0 * dVar3 + b);
        x = hcephes_incbet(b,y0,x0);
        if (ABS((x - d) / d) < 0.2) goto LAB_00107866;
      }
LAB_001073e9:
      do {
        local_ac = 0;
        dithresh = 0.5;
        for (dir = 0; dir < 100; dir = dir + 1) {
          if (dir != 0) {
            x0 = dithresh * (lgm - x1) + x1;
            if ((x0 == 1.0) && (!NAN(x0))) {
              x0 = 0.9999999999999999;
            }
            if ((x0 == 0.0) && (!NAN(x0))) {
              dithresh = 0.5;
              x0 = (lgm - x1) * 0.5 + x1;
              if ((x0 == 0.0) && (!NAN(x0))) goto LAB_00107846;
            }
            x = hcephes_incbet(b,y0,x0);
            if ((ABS((lgm - x1) / (lgm + x1)) < yl) || (ABS((x - d) / d) < yl)) goto LAB_00107866;
          }
          if (d <= x) {
            lgm = x0;
            if ((bVar1) && (x0 < 1.1102230246251565e-16)) {
              x0 = 0.0;
              goto LAB_00107c0c;
            }
            xt = x;
            if (local_ac < 1) {
              if (local_ac < -3) {
                dithresh = dithresh * dithresh;
              }
              else if (local_ac < -1) {
                dithresh = dithresh * 0.5;
              }
              else {
                dithresh = (x - d) / (x - yh);
              }
            }
            else {
              local_ac = 0;
              dithresh = 0.5;
            }
            local_ac = local_ac + -1;
          }
          else {
            x1 = x0;
            yh = x;
            if (local_ac < 0) {
              local_ac = 0;
              dithresh = 0.5;
            }
            else if (local_ac < 4) {
              if (local_ac < 2) {
                dithresh = (d - x) / (xt - x);
              }
              else {
                dithresh = dithresh * 0.5 + 0.5;
              }
            }
            else {
              dithresh = -(1.0 - dithresh) * (1.0 - dithresh) + 1.0;
            }
            local_ac = local_ac + 1;
            if (0.75 < x0) {
              bVar1 = !bVar1;
              d = yy0;
              y0 = bb;
              b = aa;
              if (bVar1) {
                d = 1.0 - yy0;
                y0 = aa;
                b = bb;
              }
              x0 = 1.0 - x0;
              x = hcephes_incbet(b,y0,x0);
              x1 = 0.0;
              yh = 0.0;
              lgm = 1.0;
              xt = 1.0;
              goto LAB_001073e9;
            }
          }
        }
        hcephes_mtherr("incbi",6);
        if (1.0 <= x1) {
          x0 = 0.9999999999999999;
          goto LAB_00107c0c;
        }
        if (x0 <= 0.0) goto LAB_00107846;
LAB_00107866:
        if (bVar2) goto LAB_00107c0c;
        bVar2 = true;
        dVar3 = hcephes_lgam(b + y0);
        dVar4 = hcephes_lgam(b);
        dVar5 = hcephes_lgam(y0);
        for (dir = 0; dir < 8; dir = dir + 1) {
          if (dir != 0) {
            x = hcephes_incbet(b,y0,x0);
          }
          if (yh <= x) {
            if (x <= xt) {
              if (d <= x) {
                lgm = x0;
                xt = x;
              }
              else {
                x1 = x0;
                yh = x;
              }
            }
            else {
              x0 = lgm;
              x = xt;
            }
          }
          else {
            x0 = x1;
            x = yh;
          }
          if (((x0 == 1.0) && (!NAN(x0))) || ((x0 == 0.0 && (!NAN(x0))))) break;
          dVar6 = log(x0);
          dVar7 = log(1.0 - x0);
          dVar6 = (b - 1.0) * dVar6 + (y0 - 1.0) * dVar7 + ((dVar3 - dVar4) - dVar5);
          if (dVar6 < -745.1332191019412) goto LAB_00107c0c;
          if (709.782712893384 < dVar6) break;
          dVar6 = exp(dVar6);
          dVar6 = (x - d) / dVar6;
          _rflg = x0 - dVar6;
          if (_rflg <= x1) {
            x = (x0 - x1) / (lgm - x1);
            _rflg = x * 0.5 * (x0 - x1) + x1;
            if (_rflg <= 0.0) break;
          }
          if (lgm <= _rflg) {
            x = (lgm - x0) / (lgm - x1);
            _rflg = -(x * 0.5) * (lgm - x0) + lgm;
            if (1.0 <= _rflg) break;
          }
          x0 = _rflg;
          if (ABS(dVar6 / _rflg) < 1.4210854715202004e-14) goto LAB_00107c0c;
        }
        yl = 2.842170943040401e-14;
      } while( true );
    }
    aa_local = 1.0;
  }
  return aa_local;
}

Assistant:

HCEPHES_API double hcephes_incbi(double aa, double bb, double yy0) {
    double a, b, y0, d, y, x, x0, x1, lgm, yp, di, dithresh, yl, yh, xt;
    int i, rflg, dir, nflg;

    i = 0;
    if (yy0 <= 0)
        return (0.0);
    if (yy0 >= 1.0)
        return (1.0);
    x0 = 0.0;
    yl = 0.0;
    x1 = 1.0;
    yh = 1.0;
    nflg = 0;

    if (aa <= 1.0 || bb <= 1.0) {
        dithresh = 1.0e-6;
        rflg = 0;
        a = aa;
        b = bb;
        y0 = yy0;
        x = a / (a + b);
        y = hcephes_incbet(a, b, x);
        goto ihalve;
    } else {
        dithresh = 1.0e-4;
    }
    /* approximation to inverse function */

    yp = -hcephes_ndtri(yy0);

    if (yy0 > 0.5) {
        rflg = 1;
        a = bb;
        b = aa;
        y0 = 1.0 - yy0;
        yp = -yp;
    } else {
        rflg = 0;
        a = aa;
        b = bb;
        y0 = yy0;
    }

    lgm = (yp * yp - 3.0) / 6.0;
    x = 2.0 / (1.0 / (2.0 * a - 1.0) + 1.0 / (2.0 * b - 1.0));
    d = yp * sqrt(x + lgm) / x - (1.0 / (2.0 * b - 1.0) - 1.0 / (2.0 * a - 1.0)) *
                                     (lgm + 5.0 / 6.0 - 2.0 / (3.0 * x));
    d = 2.0 * d;
    if (d < HCEPHES_MINLOG) {
        x = 1.0;
        goto under;
    }
    x = a / (a + b * exp(d));
    y = hcephes_incbet(a, b, x);
    yp = (y - y0) / y0;
    if (fabs(yp) < 0.2)
        goto newt;

/* Resort to interval halving if not close enough. */
ihalve:

    dir = 0;
    di = 0.5;
    for (i = 0; i < 100; i++) {
        if (i != 0) {
            x = x0 + di * (x1 - x0);
            if (x == 1.0)
                x = 1.0 - HCEPHES_MACHEP;
            if (x == 0.0) {
                di = 0.5;
                x = x0 + di * (x1 - x0);
                if (x == 0.0)
                    goto under;
            }
            y = hcephes_incbet(a, b, x);
            yp = (x1 - x0) / (x1 + x0);
            if (fabs(yp) < dithresh)
                goto newt;
            yp = (y - y0) / y0;
            if (fabs(yp) < dithresh)
                goto newt;
        }
        if (y < y0) {
            x0 = x;
            yl = y;
            if (dir < 0) {
                dir = 0;
                di = 0.5;
            } else if (dir > 3)
                di = 1.0 - (1.0 - di) * (1.0 - di);
            else if (dir > 1)
                di = 0.5 * di + 0.5;
            else
                di = (y0 - y) / (yh - yl);
            dir += 1;
            if (x0 > 0.75) {
                if (rflg == 1) {
                    rflg = 0;
                    a = aa;
                    b = bb;
                    y0 = yy0;
                } else {
                    rflg = 1;
                    a = bb;
                    b = aa;
                    y0 = 1.0 - yy0;
                }
                x = 1.0 - x;
                y = hcephes_incbet(a, b, x);
                x0 = 0.0;
                yl = 0.0;
                x1 = 1.0;
                yh = 1.0;
                goto ihalve;
            }
        } else {
            x1 = x;
            if (rflg == 1 && x1 < HCEPHES_MACHEP) {
                x = 0.0;
                goto done;
            }
            yh = y;
            if (dir > 0) {
                dir = 0;
                di = 0.5;
            } else if (dir < -3)
                di = di * di;
            else if (dir < -1)
                di = 0.5 * di;
            else
                di = (y - y0) / (yh - yl);
            dir -= 1;
        }
    }
    hcephes_mtherr("incbi", HCEPHES_PLOSS);
    if (x0 >= 1.0) {
        x = 1.0 - HCEPHES_MACHEP;
        goto done;
    }
    if (x <= 0.0) {
    under:
        hcephes_mtherr("incbi", HCEPHES_UNDERFLOW);
        x = 0.0;
        goto done;
    }

newt:

    if (nflg)
        goto done;
    nflg = 1;
    lgm = hcephes_lgam(a + b) - hcephes_lgam(a) - hcephes_lgam(b);

    for (i = 0; i < 8; i++) {
        /* Compute the function at this point. */
        if (i != 0)
            y = hcephes_incbet(a, b, x);
        if (y < yl) {
            x = x0;
            y = yl;
        } else if (y > yh) {
            x = x1;
            y = yh;
        } else if (y < y0) {
            x0 = x;
            yl = y;
        } else {
            x1 = x;
            yh = y;
        }
        if (x == 1.0 || x == 0.0)
            break;
        /* Compute the derivative of the function at this point. */
        d = (a - 1.0) * log(x) + (b - 1.0) * log(1.0 - x) + lgm;
        if (d < HCEPHES_MINLOG)
            goto done;
        if (d > HCEPHES_MAXLOG)
            break;
        d = exp(d);
        /* Compute the step to the next approximation of x. */
        d = (y - y0) / d;
        xt = x - d;
        if (xt <= x0) {
            y = (x - x0) / (x1 - x0);
            xt = x0 + 0.5 * y * (x - x0);
            if (xt <= 0.0)
                break;
        }
        if (xt >= x1) {
            y = (x1 - x) / (x1 - x0);
            xt = x1 - 0.5 * y * (x1 - x);
            if (xt >= 1.0)
                break;
        }
        x = xt;
        if (fabs(d / x) < 128.0 * HCEPHES_MACHEP)
            goto done;
    }
    /* Did not converge.  */
    dithresh = 256.0 * HCEPHES_MACHEP;
    goto ihalve;

done:

    if (rflg) {
        if (x <= HCEPHES_MACHEP)
            x = 1.0 - HCEPHES_MACHEP;
        else
            x = 1.0 - x;
    }
    return (x);
}